

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_operator_type.cpp
# Opt level: O3

string * __thiscall
duckdb::LogicalOperatorToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,LogicalOperatorType type)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 100) {
    switch(iVar2) {
    case 1:
      pcVar3 = "PROJECTION";
      pcVar1 = "";
      break;
    case 2:
      pcVar3 = "FILTER";
      pcVar1 = "";
      break;
    case 3:
      pcVar3 = "AGGREGATE";
      pcVar1 = "";
      break;
    case 4:
      pcVar3 = "WINDOW";
      pcVar1 = "";
      break;
    case 5:
      pcVar3 = "UNNEST";
      pcVar1 = "";
      break;
    case 6:
      pcVar3 = "LIMIT";
      pcVar1 = "";
      break;
    case 7:
      pcVar3 = "ORDER_BY";
      pcVar1 = "";
      break;
    case 8:
      pcVar3 = "TOP_N";
      pcVar1 = "";
      break;
    default:
      goto switchD_00d4f016_caseD_9;
    case 10:
      pcVar3 = "COPY_TO_FILE";
      pcVar1 = "";
      break;
    case 0xb:
      pcVar3 = "DISTINCT";
      pcVar1 = "";
      break;
    case 0xc:
      pcVar3 = "SAMPLE";
      pcVar1 = "";
      break;
    case 0xe:
      pcVar3 = "PIVOT";
      pcVar1 = "";
      break;
    case 0xf:
      pcVar3 = "COPY_DATABASE";
      pcVar1 = "";
      break;
    case 0x19:
      pcVar3 = "GET";
      pcVar1 = "";
      break;
    case 0x1a:
      pcVar3 = "CHUNK_GET";
      pcVar1 = "";
      break;
    case 0x1b:
      pcVar3 = "DELIM_GET";
      pcVar1 = "";
      break;
    case 0x1c:
      pcVar3 = "EXPRESSION_GET";
      pcVar1 = "";
      break;
    case 0x1d:
      pcVar3 = "DUMMY_SCAN";
      pcVar1 = "";
      break;
    case 0x1e:
      pcVar3 = "EMPTY_RESULT";
      pcVar1 = "";
      break;
    case 0x1f:
      pcVar3 = "CTE_SCAN";
      pcVar1 = "";
      break;
    case 0x32:
      pcVar3 = "JOIN";
      pcVar1 = "";
      break;
    case 0x33:
      pcVar3 = "DELIM_JOIN";
      pcVar1 = "";
      break;
    case 0x34:
      pcVar3 = "COMPARISON_JOIN";
      pcVar1 = "";
      break;
    case 0x35:
      pcVar3 = "ANY_JOIN";
      pcVar1 = "";
      break;
    case 0x36:
      pcVar3 = "CROSS_PRODUCT";
      pcVar1 = "";
      break;
    case 0x37:
      pcVar3 = "POSITIONAL_JOIN";
      pcVar1 = "";
      break;
    case 0x38:
      pcVar3 = "ASOF_JOIN";
      pcVar1 = "";
      break;
    case 0x39:
      pcVar3 = "DEPENDENT_JOIN";
      pcVar1 = "";
      break;
    case 0x4b:
      pcVar3 = "UNION";
      pcVar1 = "";
      break;
    case 0x4c:
      pcVar3 = "EXCEPT";
      pcVar1 = "";
      break;
    case 0x4d:
      pcVar3 = "INTERSECT";
      pcVar1 = "";
      break;
    case 0x4e:
      pcVar3 = "REC_CTE";
      pcVar1 = "";
      break;
    case 0x4f:
      pcVar3 = "CTE";
      pcVar1 = "";
    }
    goto LAB_00d4f4d9;
  }
  if (iVar2 < 0x96) {
    switch(iVar2) {
    case 100:
      pcVar3 = "INSERT";
      pcVar1 = "";
      break;
    case 0x65:
      pcVar3 = "DELETE";
      pcVar1 = "";
      break;
    case 0x66:
      pcVar3 = "UPDATE";
      pcVar1 = "";
      break;
    default:
      goto switchD_00d4f016_caseD_9;
    case 0x7d:
      pcVar3 = "ALTER";
      pcVar1 = "";
      break;
    case 0x7e:
      pcVar3 = "CREATE_TABLE";
      pcVar1 = "";
      break;
    case 0x7f:
      pcVar3 = "CREATE_INDEX";
      pcVar1 = "";
      break;
    case 0x80:
      pcVar3 = "CREATE_SEQUENCE";
      pcVar1 = "";
      break;
    case 0x81:
      pcVar3 = "CREATE_VIEW";
      pcVar1 = "";
      break;
    case 0x82:
      pcVar3 = "CREATE_SCHEMA";
      pcVar1 = "";
      break;
    case 0x83:
      pcVar3 = "CREATE_MACRO";
      pcVar1 = "";
      break;
    case 0x84:
      pcVar3 = "DROP";
      pcVar1 = "";
      break;
    case 0x85:
      pcVar3 = "PRAGMA";
      pcVar1 = "";
      break;
    case 0x86:
      pcVar3 = "TRANSACTION";
      pcVar1 = "";
      break;
    case 0x87:
      pcVar3 = "CREATE_TYPE";
      pcVar1 = "";
      break;
    case 0x88:
      pcVar3 = "ATTACH";
      pcVar1 = "";
      break;
    case 0x89:
      pcVar3 = "DETACH";
      pcVar1 = "";
    }
  }
  else {
    switch(iVar2) {
    case 0xaf:
      pcVar3 = "PREPARE";
      pcVar1 = "";
      break;
    case 0xb0:
      pcVar3 = "EXECUTE";
      pcVar1 = "";
      break;
    case 0xb1:
      pcVar3 = "EXPORT";
      pcVar1 = "";
      break;
    case 0xb2:
      pcVar3 = "VACUUM";
      pcVar1 = "";
      break;
    case 0xb3:
      pcVar3 = "SET";
      pcVar1 = "";
      break;
    case 0xb4:
      pcVar3 = "LOAD";
      pcVar1 = "";
      break;
    case 0xb5:
      pcVar3 = "RESET";
      pcVar1 = "";
      break;
    case 0xb6:
      pcVar3 = "UPDATE_EXTENSIONS";
      pcVar1 = "";
      break;
    case 0xbe:
      pcVar3 = "CREATE_SECRET";
      pcVar1 = "";
      break;
    default:
      if (iVar2 == 0x96) {
        pcVar3 = "EXPLAIN";
        pcVar1 = "";
        break;
      }
      if (iVar2 == 0xff) {
        pcVar3 = "CUSTOM_OP";
        pcVar1 = "";
        break;
      }
    case 0xb7:
    case 0xb8:
    case 0xb9:
    case 0xba:
    case 0xbb:
    case 0xbc:
    case 0xbd:
switchD_00d4f016_caseD_9:
      pcVar3 = "INVALID";
      pcVar1 = "";
    }
  }
LAB_00d4f4d9:
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string LogicalOperatorToString(LogicalOperatorType type) {
	switch (type) {
	case LogicalOperatorType::LOGICAL_GET:
		return "GET";
	case LogicalOperatorType::LOGICAL_CHUNK_GET:
		return "CHUNK_GET";
	case LogicalOperatorType::LOGICAL_DELIM_GET:
		return "DELIM_GET";
	case LogicalOperatorType::LOGICAL_EMPTY_RESULT:
		return "EMPTY_RESULT";
	case LogicalOperatorType::LOGICAL_EXPRESSION_GET:
		return "EXPRESSION_GET";
	case LogicalOperatorType::LOGICAL_ANY_JOIN:
		return "ANY_JOIN";
	case LogicalOperatorType::LOGICAL_ASOF_JOIN:
		return "ASOF_JOIN";
	case LogicalOperatorType::LOGICAL_DEPENDENT_JOIN:
		return "DEPENDENT_JOIN";
	case LogicalOperatorType::LOGICAL_COMPARISON_JOIN:
		return "COMPARISON_JOIN";
	case LogicalOperatorType::LOGICAL_DELIM_JOIN:
		return "DELIM_JOIN";
	case LogicalOperatorType::LOGICAL_PROJECTION:
		return "PROJECTION";
	case LogicalOperatorType::LOGICAL_FILTER:
		return "FILTER";
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		return "AGGREGATE";
	case LogicalOperatorType::LOGICAL_WINDOW:
		return "WINDOW";
	case LogicalOperatorType::LOGICAL_UNNEST:
		return "UNNEST";
	case LogicalOperatorType::LOGICAL_LIMIT:
		return "LIMIT";
	case LogicalOperatorType::LOGICAL_ORDER_BY:
		return "ORDER_BY";
	case LogicalOperatorType::LOGICAL_TOP_N:
		return "TOP_N";
	case LogicalOperatorType::LOGICAL_SAMPLE:
		return "SAMPLE";
	case LogicalOperatorType::LOGICAL_COPY_TO_FILE:
		return "COPY_TO_FILE";
	case LogicalOperatorType::LOGICAL_COPY_DATABASE:
		return "COPY_DATABASE";
	case LogicalOperatorType::LOGICAL_JOIN:
		return "JOIN";
	case LogicalOperatorType::LOGICAL_CROSS_PRODUCT:
		return "CROSS_PRODUCT";
	case LogicalOperatorType::LOGICAL_POSITIONAL_JOIN:
		return "POSITIONAL_JOIN";
	case LogicalOperatorType::LOGICAL_UNION:
		return "UNION";
	case LogicalOperatorType::LOGICAL_EXCEPT:
		return "EXCEPT";
	case LogicalOperatorType::LOGICAL_INTERSECT:
		return "INTERSECT";
	case LogicalOperatorType::LOGICAL_INSERT:
		return "INSERT";
	case LogicalOperatorType::LOGICAL_DISTINCT:
		return "DISTINCT";
	case LogicalOperatorType::LOGICAL_DELETE:
		return "DELETE";
	case LogicalOperatorType::LOGICAL_UPDATE:
		return "UPDATE";
	case LogicalOperatorType::LOGICAL_PREPARE:
		return "PREPARE";
	case LogicalOperatorType::LOGICAL_DUMMY_SCAN:
		return "DUMMY_SCAN";
	case LogicalOperatorType::LOGICAL_CREATE_INDEX:
		return "CREATE_INDEX";
	case LogicalOperatorType::LOGICAL_CREATE_TABLE:
		return "CREATE_TABLE";
	case LogicalOperatorType::LOGICAL_CREATE_MACRO:
		return "CREATE_MACRO";
	case LogicalOperatorType::LOGICAL_EXPLAIN:
		return "EXPLAIN";
	case LogicalOperatorType::LOGICAL_EXECUTE:
		return "EXECUTE";
	case LogicalOperatorType::LOGICAL_VACUUM:
		return "VACUUM";
	case LogicalOperatorType::LOGICAL_RECURSIVE_CTE:
		return "REC_CTE";
	case LogicalOperatorType::LOGICAL_MATERIALIZED_CTE:
		return "CTE";
	case LogicalOperatorType::LOGICAL_CTE_REF:
		return "CTE_SCAN";
	case LogicalOperatorType::LOGICAL_ALTER:
		return "ALTER";
	case LogicalOperatorType::LOGICAL_CREATE_SEQUENCE:
		return "CREATE_SEQUENCE";
	case LogicalOperatorType::LOGICAL_CREATE_TYPE:
		return "CREATE_TYPE";
	case LogicalOperatorType::LOGICAL_CREATE_VIEW:
		return "CREATE_VIEW";
	case LogicalOperatorType::LOGICAL_CREATE_SCHEMA:
		return "CREATE_SCHEMA";
	case LogicalOperatorType::LOGICAL_CREATE_SECRET:
		return "CREATE_SECRET";
	case LogicalOperatorType::LOGICAL_ATTACH:
		return "ATTACH";
	case LogicalOperatorType::LOGICAL_DETACH:
		return "DETACH";
	case LogicalOperatorType::LOGICAL_DROP:
		return "DROP";
	case LogicalOperatorType::LOGICAL_PRAGMA:
		return "PRAGMA";
	case LogicalOperatorType::LOGICAL_TRANSACTION:
		return "TRANSACTION";
	case LogicalOperatorType::LOGICAL_EXPORT:
		return "EXPORT";
	case LogicalOperatorType::LOGICAL_SET:
		return "SET";
	case LogicalOperatorType::LOGICAL_RESET:
		return "RESET";
	case LogicalOperatorType::LOGICAL_LOAD:
		return "LOAD";
	case LogicalOperatorType::LOGICAL_INVALID:
		break;
	case LogicalOperatorType::LOGICAL_EXTENSION_OPERATOR:
		return "CUSTOM_OP";
	case LogicalOperatorType::LOGICAL_PIVOT:
		return "PIVOT";
	case LogicalOperatorType::LOGICAL_UPDATE_EXTENSIONS:
		return "UPDATE_EXTENSIONS";
	}
	return "INVALID";
}